

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O2

Status __thiscall osqp::OsqpSolver::UpdateMaxIter(OsqpSolver *this,int max_iter_new)

{
  c_int cVar1;
  AlphaNum *in_RCX;
  uint in_EDX;
  undefined4 in_register_00000034;
  string_view message;
  string_view message_00;
  string_view message_01;
  string local_a8;
  AlphaNum local_88;
  string_view local_58 [3];
  
  if (*(OSQPWorkspace **)CONCAT44(in_register_00000034,max_iter_new) == (OSQPWorkspace *)0x0) {
    message_00._M_str = (char *)0x1e;
    message_00._M_len = (size_t)this;
    absl::FailedPreconditionError(message_00);
  }
  else if ((int)in_EDX < 1) {
    local_58[0] = absl::NullSafeStringView("Invalid max_iter value: ");
    absl::AlphaNum::AlphaNum(&local_88,in_EDX);
    absl::StrCat_abi_cxx11_(&local_a8,(absl *)local_58,&local_88,in_RCX);
    message_01._M_str = (char *)local_a8._M_string_length;
    message_01._M_len = (size_t)this;
    absl::InvalidArgumentError(message_01);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  else {
    cVar1 = osqp_update_max_iter
                      (*(OSQPWorkspace **)CONCAT44(in_register_00000034,max_iter_new),(ulong)in_EDX)
    ;
    if (cVar1 == 0) {
      (this->workspace_)._M_t.
      super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
      super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
      super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl =
           (OSQPWorkspaceHelper *)0x1;
    }
    else {
      message._M_str = (char *)0x29;
      message._M_len = (size_t)this;
      absl::UnknownError(message);
    }
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status OsqpSolver::UpdateMaxIter(const int max_iter_new) {
  if (!IsInitialized()) {
    return absl::FailedPreconditionError("OsqpSolver is not initialized.");
  }
  if (max_iter_new <= 0) {
    return absl::InvalidArgumentError(
        absl::StrCat("Invalid max_iter value: ", max_iter_new));
  }
  if (osqp_update_max_iter(workspace_.get(), max_iter_new) != 0) {
    return absl::UnknownError("osqp_update_max_iter unexpectedly failed.");
  }
  return absl::OkStatus();
}